

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::IsUnboundedFunction::checkArguments
          (IsUnboundedFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  reference ppEVar3;
  ValueExpressionBase *pVVar4;
  undefined8 in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *in_RDI;
  ASTContext *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_00000020;
  size_t in_stack_00000028;
  Compilation *comp;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  DiagCode code;
  SystemSubroutine *in_stack_fffffffffffffff8;
  
  code = SUB84((ulong)in_RCX >> 0x38,0);
  this_00 = ASTContext::getCompilation((ASTContext *)0xb0f889);
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_fffffffffffffff8,in_R8,code.code._1_1_,in_RDI,in_stack_00000000,
                     in_stack_00000020,in_stack_00000028);
  if (!bVar1) {
    pTVar2 = Compilation::getErrorType(this_00);
    return pTVar2;
  }
  ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,0);
  bVar1 = ValueExpressionBase::isKind((*ppEVar3)->kind);
  if (bVar1) {
    ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                        (in_RDX,0);
    pVVar4 = Expression::as<slang::ast::ValueExpressionBase>(*ppEVar3);
    if ((pVVar4->symbol->super_Symbol).kind == Parameter) goto LAB_00b0f97a;
  }
  uVar5 = 0x2e000b;
  ppEVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                      (in_RDX,0);
  sourceRange.endLoc._0_4_ = in_stack_ffffffffffffffa8;
  sourceRange.startLoc = ((*ppEVar3)->sourceRange).endLoc;
  sourceRange.endLoc._4_4_ = uVar5;
  ASTContext::addDiag((ASTContext *)((*ppEVar3)->sourceRange).startLoc,code,sourceRange);
LAB_00b0f97a:
  pTVar2 = Compilation::getBitType(this_00);
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        if (!ValueExpressionBase::isKind(args[0]->kind) ||
            args[0]->as<ValueExpressionBase>().symbol.kind != SymbolKind::Parameter) {
            context.addDiag(diag::IsUnboundedParamArg, args[0]->sourceRange);
        }

        return comp.getBitType();
    }